

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iremga20.c
# Opt level: O0

void iremga20_write_rom(void *info,UINT32 offset,UINT32 length,UINT8 *data)

{
  ga20_state *chip;
  UINT8 *data_local;
  UINT32 length_local;
  UINT32 offset_local;
  void *info_local;
  
  if (offset <= *(uint *)((long)info + 0x10)) {
    data_local._0_4_ = length;
    if (*(uint *)((long)info + 0x10) < offset + length) {
      data_local._0_4_ = *(int *)((long)info + 0x10) - offset;
    }
    memcpy((void *)(*(long *)((long)info + 8) + (ulong)offset),data,(ulong)(UINT32)data_local);
  }
  return;
}

Assistant:

static void iremga20_write_rom(void *info, UINT32 offset, UINT32 length, const UINT8* data)
{
	ga20_state *chip = (ga20_state *)info;
	
	if (offset > chip->rom_size)
		return;
	if (offset + length > chip->rom_size)
		length = chip->rom_size - offset;
	
	memcpy(chip->rom + offset, data, length);
	
	return;
}